

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

SegmentBuilder * __thiscall capnp::_::BuilderArena::getSegment(BuilderArena *this,SegmentId id)

{
  MultiSegmentState *pMVar1;
  ulong uVar2;
  SegmentBuilder *pSVar3;
  SegmentId id_local;
  Fault f;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  
  if (id.value == 0) {
    pSVar3 = &this->segment0;
  }
  else {
    id_local = id;
    if ((this->moreSegments).ptr.ptr == (MultiSegmentState *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],unsigned_int&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xdd,FAILED,(char *)0x0,"\"invalid segment id\", id.value",
                 (char (*) [19])"invalid segment id",&id_local.value);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    pMVar1 = (this->moreSegments).ptr.ptr;
    _kjCondition.left = id.value - 1;
    uVar2 = (ulong)_kjCondition.left;
    _kjCondition.right =
         (long)(pMVar1->builders).builder.pos - (long)(pMVar1->builders).builder.ptr >> 4;
    _kjCondition.op.content.ptr = " < ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = uVar2 < _kjCondition.right;
    if (_kjCondition.right <= uVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,char_const(&)[19],unsigned_int&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xda,FAILED,"id.value - 1 < s.get()->builders.size()",
                 "_kjCondition,\"invalid segment id\", id.value",&_kjCondition,
                 (char (*) [19])"invalid segment id",&id_local.value);
      kj::_::Debug::Fault::fatal(&f);
    }
    pSVar3 = (pMVar1->builders).builder.ptr[uVar2].ptr;
  }
  return pSVar3;
}

Assistant:

SegmentBuilder* BuilderArena::getSegment(SegmentId id) {
  // This method is allowed to fail if the segment ID is not valid.
  if (id == SegmentId(0)) {
    return &segment0;
  } else {
    KJ_IF_SOME(s, moreSegments) {
      KJ_REQUIRE(id.value - 1 < s.get()->builders.size(), "invalid segment id", id.value);
      return const_cast<SegmentBuilder*>(s.get()->builders[id.value - 1].get());
    } else {
      KJ_FAIL_REQUIRE("invalid segment id", id.value);
    }
  }